

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_Objs_Test::TestBody(ProblemTest_Objs_Test *this)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *pBVar4;
  ulong uVar5;
  int iVar6;
  char *pcVar7;
  char *in_R9;
  MutObjective MVar8;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  other;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  other_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  iterator j;
  iterator i;
  Problem p;
  AssertionResult local_3e8;
  BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_3d8;
  string local_3c8;
  iterator local_3a8;
  iterator local_398;
  AssertHelper local_380;
  BasicProblem<mp::BasicProblemParams<int>_> local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_378);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&local_378,MAX,(NumericExpr)0x0,0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddObj(&local_378,MIN,(NumericExpr)0x0,0);
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  _8_8_ = (ulong)(uint)local_398.item_.
                       super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                       ._12_4_ << 0x20;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_ = &local_378;
  MVar8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_378,0);
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_._0_4_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_;
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_._4_4_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_;
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = MVar8.
           super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pBVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator->(&local_398);
  local_3e8._0_8_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       problem_;
  local_3e8.message_.ptr_._0_4_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       index_;
  testing::internal::
  CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((internal *)&local_3c8,"p.obj(0)","*i",(MutObjective *)&local_3a8,
             (BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)&local_3e8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x103,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3e8,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e8);
    if (((CONCAT44(local_3a8.item_.
                   super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                   problem_._4_4_,
                   local_3a8.item_.
                   super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                   problem_._0_4_) != 0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((long *)CONCAT44(local_3a8.item_.
                         super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                         .problem_._4_4_,
                         local_3a8.item_.
                         super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                         .problem_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_3a8.item_.
                                     super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                     .problem_._4_4_,
                                     local_3a8.item_.
                                     super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                     .problem_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_._0_4_ = 1;
  pBVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator->(&local_398);
  uVar2 = local_3e8._0_8_;
  iVar1 = (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
          index_;
  uVar5 = (ulong)iVar1;
  iVar6 = iVar1 + 0x3f;
  if (-1 < (long)uVar5) {
    iVar6 = iVar1;
  }
  local_3e8._1_3_ = 0;
  local_3e8.success_ =
       (*(ulong *)((long)(iVar6 >> 6) * 8 +
                   *(long *)&(((pBVar4->
                               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                               ).problem_)->is_obj_max_).super__Bvector_base<std::allocator<bool>_>.
                             _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base + -8
                  + (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
        (uVar5 & 0x3f) & 1) != 0;
  local_3e8._4_4_ = SUB84(uVar2,4);
  testing::internal::CmpHelperEQ<mp::obj::Type,mp::obj::Type>
            ((internal *)&local_3c8,"mp::obj::MAX","i->type()",(Type *)&local_3a8,(Type *)&local_3e8
            );
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3a8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x105,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3e8,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3e8);
    if (((CONCAT44(local_3a8.item_.
                   super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                   problem_._4_4_,
                   local_3a8.item_.
                   super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                   problem_._0_4_) != 0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((long *)CONCAT44(local_3a8.item_.
                         super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                         .problem_._4_4_,
                         local_3a8.item_.
                         super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                         .problem_._0_4_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT44(local_3a8.item_.
                                     super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                     .problem_._4_4_,
                                     local_3a8.item_.
                                     super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
                                     .problem_._0_4_) + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = local_398.item_.
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = local_398.item_.
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ + 1;
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_._0_4_ =
       SUB84(local_398.item_.
             super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_,
             0);
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_._4_4_ =
       (undefined4)
       ((ulong)local_398.item_.
               super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
               problem_ >> 0x20);
  MVar8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_378,0);
  local_3e8._0_8_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.message_.ptr_._0_4_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pBVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator->(&local_3a8);
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       problem_;
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       index_;
  testing::internal::
  CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((internal *)&local_3c8,"p.obj(0)","*j",(MutObjective *)&local_3e8,&local_3d8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x108,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
    if ((((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
          (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((ExprFactory *)local_3e8._0_8_)->_vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_378,1);
  local_3e8._0_8_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.message_.ptr_._0_4_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pBVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator->(&local_398);
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       problem_;
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       index_;
  testing::internal::
  CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((internal *)&local_3c8,"p.obj(1)","*i",(MutObjective *)&local_3e8,&local_3d8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x109,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
    if ((((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
          (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((ExprFactory *)local_3e8._0_8_)->_vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  other.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._4_4_
       = local_3a8.item_.
         super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_.
         _4_4_;
  other.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_._0_4_
       = local_3a8.item_.
         super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_.
         _0_4_;
  other.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
       .index_;
  other.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  bVar3 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>
          ::operator==((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>
                        *)&local_398,other);
  local_3e8.success_ = !bVar3;
  local_3e8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar3) {
    testing::Message::Message((Message *)&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3c8,(internal *)&local_3e8,(AssertionResult *)"i != j","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x10a,local_3c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (((local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
          problem_ != (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
        problem_ != (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
         problem_)->super_ExprFactory)._vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = local_3a8.item_.
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ + 1;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  problem_ = (BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(local_3a8.item_.
                      super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                      problem_._4_4_,
                      local_3a8.item_.
                      super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                      problem_._0_4_);
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  _12_4_ = local_3a8.item_.
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_;
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = local_3a8.item_.
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  MVar8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_378,1);
  local_3e8._0_8_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.message_.ptr_._0_4_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pBVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator->(&local_3a8);
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       problem_;
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       index_;
  testing::internal::
  CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((internal *)&local_3c8,"p.obj(1)","*j",(MutObjective *)&local_3e8,&local_3d8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x10d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
    if ((((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
          (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((ExprFactory *)local_3e8._0_8_)->_vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  MVar8 = mp::BasicProblem<mp::BasicProblemParams<int>_>::obj(&local_378,1);
  local_3e8._0_8_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_3e8.message_.ptr_._0_4_ =
       MVar8.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pBVar4 = mp::BasicProblem<mp::BasicProblemParams<int>_>::
           Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           ::iterator::operator->(&local_398);
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       problem_;
  local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       (pBVar4->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
       index_;
  testing::internal::
  CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
            ((internal *)&local_3c8,"p.obj(1)","*i",(MutObjective *)&local_3e8,&local_3d8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x10e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
    if ((((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
          (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((ExprFactory *)local_3e8._0_8_)->_vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  other_00.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_.
  _4_4_ = local_3a8.item_.
          super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_.
          _4_4_;
  other_00.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_.
  _0_4_ = local_3a8.item_.
          super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_.
          _0_4_;
  other_00.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       local_3a8.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>
       .index_;
  other_00.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  bVar3 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>
          ::operator==((BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>
                        *)&local_398,other_00);
  local_3e8.success_ = bVar3;
  local_3e8.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_3d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3c8,(internal *)&local_3e8,(AssertionResult *)"i == j","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_380,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x10f,local_3c8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_380,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (((local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
          problem_ != (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       (local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
        problem_ != (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((local_3d8.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
         problem_)->super_ExprFactory)._vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_3e8.message_.ptr_._0_4_ =
       (int)((ulong)((long)local_378.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_378.linear_objs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  local_3e8._0_8_ = &local_378;
  testing::internal::
  CmpHelperNE<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
            ((internal *)&local_3c8,"i","objs.end()",&local_398,(iterator *)&local_3e8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x111,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
    if ((((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
          (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((ExprFactory *)local_3e8._0_8_)->_vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_398.item_.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
  index_ = local_398.item_.
           super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ + 1;
  local_3e8.message_.ptr_._0_4_ =
       (int)((ulong)((long)local_378.linear_objs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_378.linear_objs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  local_3e8._0_8_ = &local_378;
  testing::internal::
  CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator,mp::BasicProblem<mp::BasicProblemParams<int>>::Range<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>::iterator>
            ((internal *)&local_3c8,"++i","objs.end()",&local_398,(iterator *)&local_3e8);
  if ((char)local_3c8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_3e8);
    if ((undefined8 *)local_3c8._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_3c8._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x112,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
    if ((((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
          (BasicProblem<mp::BasicProblemParams<int>_> *)0x0) &&
        (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
       ((BasicProblem<mp::BasicProblemParams<int>_> *)local_3e8._0_8_ !=
        (BasicProblem<mp::BasicProblemParams<int>_> *)0x0)) {
      (*((ExprFactory *)local_3e8._0_8_)->_vptr_BasicExprFactory[1])();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_3c8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((internal)local_3e8.success_ == (internal)0x1) {
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"invalid access","");
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::
      Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
      ::iterator::operator->(&local_398);
    }
    testing::AssertionResult::operator<<
              (&local_3e8,
               (char (*) [95])
               "Expected: i->type() throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3c8);
  if (local_3e8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = ((local_3e8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x114,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_3c8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if ((internal)local_3e8.success_ == (internal)0x1) {
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"invalid access","");
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::
      Range<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
      ::iterator::operator->(&local_398);
    }
    testing::AssertionResult::operator<<
              (&local_3e8,
               (char (*) [88])
               "Expected: *i throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_3c8);
  if (local_3e8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar7 = "";
  }
  else {
    pcVar7 = ((local_3e8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_3d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x115,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_3d8,(Message *)&local_3c8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3d8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar3 = testing::internal::IsTrue(true), bVar3)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_3c8._M_dataplus._M_p + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3e8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_378);
  return;
}

Assistant:

TEST(ProblemTest, Objs) {
  Problem p;
  p.AddObj(mp::obj::MAX);
  p.AddObj(mp::obj::MIN);
  Problem::ObjRange objs = p.objs();
  Problem::ObjRange::iterator i = objs.begin();
  // Test dereference.
  EXPECT_EQ(p.obj(0), *i);
  // Test the arrow operator.
  EXPECT_EQ(mp::obj::MAX, i->type());
  // Test postincrement.
  Problem::ObjRange::iterator j = i++;
  EXPECT_EQ(p.obj(0), *j);
  EXPECT_EQ(p.obj(1), *i);
  EXPECT_TRUE(i != j);
  // Test preincrement.
  i = ++j;
  EXPECT_EQ(p.obj(1), *j);
  EXPECT_EQ(p.obj(1), *i);
  EXPECT_TRUE(i == j);
  // Test end.
  EXPECT_NE(i, objs.end());
  EXPECT_EQ(++i, objs.end());
  // Test invalid access.
  EXPECT_ASSERT(i->type(), "invalid access");
  EXPECT_ASSERT(*i, "invalid access");
}